

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall CClient::RegisterCommands(CClient *this)

{
  IKernel *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  IConsole *pIVar3;
  
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"console");
  pIVar3 = (IConsole *)CONCAT44(extraout_var,iVar2);
  this->m_pConsole = pIVar3;
  (*(pIVar3->super_IInterface)._vptr_IInterface[8])
            (pIVar3,"quit","",10,Con_Quit,this,"Quit Teeworlds");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"exit","",10,Con_Quit,this,"Quit Teeworlds");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"minimize","",10,Con_Minimize,this,"Minimize Teeworlds");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"connect","s[host|ip]",10,Con_Connect,this,
             "Connect to the specified host/ip");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"disconnect","",2,Con_Disconnect,this,"Disconnect from the server");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"ping","",2,Con_Ping,this,"Ping the current server");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"screenshot","",2,Con_Screenshot,this,"Take a screenshot");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"rcon","r[command]",2,Con_Rcon,this,"Send specified command to rcon");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"rcon_auth","s[password]",2,Con_RconAuth,this,"Authenticate to rcon");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"record","?s[file]",2,Con_Record,this,"Record to the file");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"stoprecord","",2,Con_StopRecord,this,"Stop recording");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"add_demomarker","",2,Con_AddDemoMarker,this,
             "Add demo timeline marker");
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"br_filter_string",ConchainServerBrowserUpdate,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"gfx_screen",ConchainWindowScreen,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"gfx_fullscreen",ConchainFullscreen,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"gfx_borderless",ConchainWindowBordered,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0xf])
            (this->m_pConsole,"gfx_vsync",ConchainWindowVSync,this);
  return;
}

Assistant:

void CClient::RegisterCommands()
{
	m_pConsole = Kernel()->RequestInterface<IConsole>();

	m_pConsole->Register("quit", "", CFGFLAG_CLIENT|CFGFLAG_STORE, Con_Quit, this, "Quit Teeworlds");
	m_pConsole->Register("exit", "", CFGFLAG_CLIENT|CFGFLAG_STORE, Con_Quit, this, "Quit Teeworlds");
	m_pConsole->Register("minimize", "", CFGFLAG_CLIENT|CFGFLAG_STORE, Con_Minimize, this, "Minimize Teeworlds");
	m_pConsole->Register("connect", "s[host|ip]", CFGFLAG_CLIENT|CFGFLAG_STORE, Con_Connect, this, "Connect to the specified host/ip");
	m_pConsole->Register("disconnect", "", CFGFLAG_CLIENT, Con_Disconnect, this, "Disconnect from the server");
	m_pConsole->Register("ping", "", CFGFLAG_CLIENT, Con_Ping, this, "Ping the current server");
	m_pConsole->Register("screenshot", "", CFGFLAG_CLIENT, Con_Screenshot, this, "Take a screenshot");
	m_pConsole->Register("rcon", "r[command]", CFGFLAG_CLIENT, Con_Rcon, this, "Send specified command to rcon");
	m_pConsole->Register("rcon_auth", "s[password]", CFGFLAG_CLIENT, Con_RconAuth, this, "Authenticate to rcon");
	m_pConsole->Register("record", "?s[file]", CFGFLAG_CLIENT, Con_Record, this, "Record to the file");
	m_pConsole->Register("stoprecord", "", CFGFLAG_CLIENT, Con_StopRecord, this, "Stop recording");
	m_pConsole->Register("add_demomarker", "", CFGFLAG_CLIENT, Con_AddDemoMarker, this, "Add demo timeline marker");

	// used for server browser update
	m_pConsole->Chain("br_filter_string", ConchainServerBrowserUpdate, this);

	m_pConsole->Chain("gfx_screen", ConchainWindowScreen, this);
	m_pConsole->Chain("gfx_fullscreen", ConchainFullscreen, this);
	m_pConsole->Chain("gfx_borderless", ConchainWindowBordered, this);
	m_pConsole->Chain("gfx_vsync", ConchainWindowVSync, this);
}